

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void scan_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  uint uVar2;
  int local_38;
  int local_34;
  int min_count;
  int max_count;
  int count;
  int nextlen;
  int curlen;
  int prevlen;
  int n;
  int max_code_local;
  ct_data *tree_local;
  deflate_state *s_local;
  
  nextlen = -1;
  uVar1 = (tree->dl).dad;
  min_count = 0;
  local_34 = 7;
  local_38 = 4;
  if (uVar1 == 0) {
    local_34 = 0x8a;
    local_38 = 3;
  }
  tree[max_code + 1].dl.dad = 0xffff;
  max_count = (uint)uVar1;
  for (curlen = 0; curlen <= max_code; curlen = curlen + 1) {
    uVar2 = (uint)tree[curlen + 1].dl.dad;
    min_count = min_count + 1;
    if ((local_34 <= min_count) || (max_count != uVar2)) {
      if (min_count < local_38) {
        s->bl_tree[max_count].fc.freq = s->bl_tree[max_count].fc.freq + (short)min_count;
      }
      else if (max_count == 0) {
        if (min_count < 0xb) {
          s->bl_tree[0x11].fc.freq = s->bl_tree[0x11].fc.freq + 1;
        }
        else {
          s->bl_tree[0x12].fc.freq = s->bl_tree[0x12].fc.freq + 1;
        }
      }
      else {
        if (max_count != nextlen) {
          s->bl_tree[max_count].fc.freq = s->bl_tree[max_count].fc.freq + 1;
        }
        s->bl_tree[0x10].fc.freq = s->bl_tree[0x10].fc.freq + 1;
      }
      min_count = 0;
      nextlen = max_count;
      if (uVar2 == 0) {
        local_34 = 0x8a;
        local_38 = 3;
      }
      else if (max_count == uVar2) {
        local_34 = 6;
        local_38 = 3;
      }
      else {
        local_34 = 7;
        local_38 = 4;
      }
    }
    max_count = uVar2;
  }
  return;
}

Assistant:

local void scan_tree(deflate_state *s, ct_data *tree, int max_code) {
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    if (nextlen == 0) max_count = 138, min_count = 3;
    tree[max_code + 1].Len = (ush)0xffff; /* guard */

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n + 1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            s->bl_tree[curlen].Freq += count;
        } else if (curlen != 0) {
            if (curlen != prevlen) s->bl_tree[curlen].Freq++;
            s->bl_tree[REP_3_6].Freq++;
        } else if (count <= 10) {
            s->bl_tree[REPZ_3_10].Freq++;
        } else {
            s->bl_tree[REPZ_11_138].Freq++;
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}